

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<char[8],int,char[8],int>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [8],
                   int *args_1,char (*args_2) [8],int *args_3)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_f0;
  cmAlphaNum local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  size_t local_80;
  char *pcStack_78;
  size_t local_70;
  char (*local_68) [8];
  size_t local_60;
  char *pcStack_58;
  size_t local_50;
  char (*local_48) [8];
  size_t local_40;
  char *pcStack_38;
  
  local_90._M_len = (a->View_)._M_len;
  local_90._M_str = (a->View_)._M_str;
  local_80 = (b->View_)._M_len;
  pcStack_78 = (b->View_)._M_str;
  local_70 = strlen(*args);
  local_68 = args;
  cmAlphaNum::cmAlphaNum(&local_c0,*args_1);
  local_60 = local_c0.View_._M_len;
  pcStack_58 = local_c0.View_._M_str;
  local_50 = strlen(*args_2);
  local_48 = args_2;
  cmAlphaNum::cmAlphaNum(&local_f0,*args_3);
  local_40 = local_f0.View_._M_len;
  pcStack_38 = local_f0.View_._M_str;
  views._M_len = 6;
  views._M_array = &local_90;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}